

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

jpegls_errc charls::to_jpegls_errc(void)

{
  long lVar1;
  jpegls_errc jVar2;
  undefined1 auVar3 [12];
  
  auVar3 = __cxa_rethrow();
  if (auVar3._8_4_ == 3) {
    lVar1 = __cxa_begin_catch(auVar3._0_8_);
    jVar2 = *(jpegls_errc *)(lVar1 + 0x10);
    __cxa_end_catch();
  }
  else {
    __cxa_begin_catch(auVar3._0_8_);
    __cxa_end_catch();
    jVar2 = (auVar3._8_4_ != 2) + not_enough_memory;
  }
  return jVar2;
}

Assistant:

inline jpegls_errc to_jpegls_errc() noexcept
{
    try
    {
        // re-trow the exception.
        throw;
    }
    catch (const jpegls_error& error)
    {
        return static_cast<jpegls_errc>(error.code().value());
    }
    catch (const std::bad_alloc&)
    {
        return jpegls_errc::not_enough_memory;
    }
    catch (...)
    {
        return jpegls_errc::unexpected_failure;
    }
}